

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.c
# Opt level: O1

int yaml_emitter_flush(yaml_emitter_t *emitter)

{
  uchar **ppuVar1;
  byte bVar2;
  yaml_encoding_t yVar3;
  yaml_write_handler_t *pyVar4;
  uchar *puVar5;
  uchar *puVar6;
  yaml_char_t *pyVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uchar uVar13;
  byte *pbVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  
  if (emitter == (yaml_emitter_t *)0x0) {
    __assert_fail("emitter",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/writer.c"
                  ,0x24,"int yaml_emitter_flush(yaml_emitter_t *)");
  }
  pyVar4 = emitter->write_handler;
  if (pyVar4 != (yaml_write_handler_t *)0x0) {
    yVar3 = emitter->encoding;
    if (yVar3 == YAML_ANY_ENCODING) {
      __assert_fail("emitter->encoding",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/writer.c"
                    ,0x26,"int yaml_emitter_flush(yaml_emitter_t *)");
    }
    puVar5 = (emitter->buffer).start;
    puVar6 = (emitter->buffer).pointer;
    (emitter->buffer).last = puVar6;
    (emitter->buffer).pointer = puVar5;
    iVar8 = 1;
    if (puVar5 != puVar6) {
      if (yVar3 == YAML_UTF8_ENCODING) {
        iVar8 = (*pyVar4)(emitter->write_handler_data,puVar5,(long)puVar6 - (long)puVar5);
        if (iVar8 != 0) {
          pyVar7 = (emitter->buffer).start;
          (emitter->buffer).last = pyVar7;
          (emitter->buffer).pointer = pyVar7;
          return 1;
        }
      }
      else {
        pbVar14 = (emitter->buffer).pointer;
        if (pbVar14 != (emitter->buffer).last) {
          uVar9 = (ulong)(yVar3 != YAML_UTF16LE_ENCODING);
          uVar10 = (ulong)(yVar3 == YAML_UTF16LE_ENCODING);
          do {
            bVar2 = *pbVar14;
            uVar12 = (uint)bVar2;
            lVar15 = 1;
            uVar11 = (uint)bVar2;
            if ((((char)bVar2 < '\0') && (lVar15 = 2, (bVar2 & 0xe0) != 0xc0)) &&
               (lVar15 = 3, (bVar2 & 0xf0) != 0xe0)) {
              lVar15 = (ulong)((uVar11 & 0xfffffff8) == 0xf0) << 2;
            }
            if ((char)bVar2 < '\0') {
              if ((uVar11 & 0xffffffe0) == 0xc0) {
                uVar12 = uVar11 & 0x1f;
              }
              else if ((bVar2 & 0xf0) == 0xe0) {
                uVar12 = uVar11 & 0xf;
              }
              else {
                uVar12 = uVar11 & 7;
                if ((bVar2 & 0xf8) != 0xf0) {
                  uVar12 = 0;
                }
              }
            }
            if (1 < (uint)lVar15) {
              lVar16 = 1;
              do {
                uVar12 = uVar12 << 6 | pbVar14[lVar16] & 0x3f;
                lVar16 = lVar16 + 1;
              } while (lVar15 != lVar16);
            }
            (emitter->buffer).pointer = pbVar14 + lVar15;
            uVar13 = (uchar)(uVar12 >> 8);
            if (uVar12 < 0x10000) {
              lVar15 = 2;
              uVar17 = uVar10;
              uVar18 = uVar9;
            }
            else {
              (emitter->raw_buffer).last[uVar10] = (char)(uVar12 - 0x10000 >> 0x12) + 0xd8;
              (emitter->raw_buffer).last[uVar9] = (uchar)(uVar12 - 0x10000 >> 10);
              uVar13 = uVar13 + 0xdc;
              lVar15 = 4;
              uVar17 = uVar9 ^ 3;
              uVar18 = uVar9 + 2;
            }
            (emitter->raw_buffer).last[uVar17] = uVar13;
            (emitter->raw_buffer).last[uVar18] = (uchar)uVar12;
            ppuVar1 = &(emitter->raw_buffer).last;
            *ppuVar1 = *ppuVar1 + lVar15;
            pbVar14 = (emitter->buffer).pointer;
          } while (pbVar14 != (emitter->buffer).last);
        }
        puVar5 = (emitter->raw_buffer).start;
        iVar8 = (*emitter->write_handler)
                          (emitter->write_handler_data,puVar5,
                           (long)(emitter->raw_buffer).last - (long)puVar5);
        if (iVar8 != 0) {
          pyVar7 = (emitter->buffer).start;
          puVar5 = (emitter->raw_buffer).start;
          (emitter->buffer).last = pyVar7;
          (emitter->buffer).pointer = pyVar7;
          (emitter->raw_buffer).last = puVar5;
          (emitter->raw_buffer).pointer = puVar5;
          return 1;
        }
      }
      emitter->error = YAML_WRITER_ERROR;
      emitter->problem = "write error";
      iVar8 = 0;
    }
    return iVar8;
  }
  __assert_fail("emitter->write_handler",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/writer.c"
                ,0x25,"int yaml_emitter_flush(yaml_emitter_t *)");
}

Assistant:

YAML_DECLARE(int)
yaml_emitter_flush(yaml_emitter_t *emitter)
{
    int low, high;

    assert(emitter);    /* Non-NULL emitter object is expected. */
    assert(emitter->write_handler); /* Write handler must be set. */
    assert(emitter->encoding);  /* Output encoding must be set. */

    emitter->buffer.last = emitter->buffer.pointer;
    emitter->buffer.pointer = emitter->buffer.start;

    /* Check if the buffer is empty. */

    if (emitter->buffer.start == emitter->buffer.last) {
        return 1;
    }

    /* If the output encoding is UTF-8, we don't need to recode the buffer. */

    if (emitter->encoding == YAML_UTF8_ENCODING)
    {
        if (emitter->write_handler(emitter->write_handler_data,
                    emitter->buffer.start,
                    emitter->buffer.last - emitter->buffer.start)) {
            emitter->buffer.last = emitter->buffer.start;
            emitter->buffer.pointer = emitter->buffer.start;
            return 1;
        }
        else {
            return yaml_emitter_set_writer_error(emitter, "write error");
        }
    }

    /* Recode the buffer into the raw buffer. */

    low = (emitter->encoding == YAML_UTF16LE_ENCODING ? 0 : 1);
    high = (emitter->encoding == YAML_UTF16LE_ENCODING ? 1 : 0);

    while (emitter->buffer.pointer != emitter->buffer.last)
    {
        unsigned char octet;
        unsigned int width;
        unsigned int value;
        size_t k;

        /*
         * See the "reader.c" code for more details on UTF-8 encoding.  Note
         * that we assume that the buffer contains a valid UTF-8 sequence.
         */

        /* Read the next UTF-8 character. */

        octet = emitter->buffer.pointer[0];

        width = (octet & 0x80) == 0x00 ? 1 :
                (octet & 0xE0) == 0xC0 ? 2 :
                (octet & 0xF0) == 0xE0 ? 3 :
                (octet & 0xF8) == 0xF0 ? 4 : 0;

        value = (octet & 0x80) == 0x00 ? octet & 0x7F :
                (octet & 0xE0) == 0xC0 ? octet & 0x1F :
                (octet & 0xF0) == 0xE0 ? octet & 0x0F :
                (octet & 0xF8) == 0xF0 ? octet & 0x07 : 0;

        for (k = 1; k < width; k ++) {
            octet = emitter->buffer.pointer[k];
            value = (value << 6) + (octet & 0x3F);
        }

        emitter->buffer.pointer += width;

        /* Write the character. */

        if (value < 0x10000)
        {
            emitter->raw_buffer.last[high] = value >> 8;
            emitter->raw_buffer.last[low] = value & 0xFF;

            emitter->raw_buffer.last += 2;
        }
        else
        {
            /* Write the character using a surrogate pair (check "reader.c"). */

            value -= 0x10000;
            emitter->raw_buffer.last[high] = 0xD8 + (value >> 18);
            emitter->raw_buffer.last[low] = (value >> 10) & 0xFF;
            emitter->raw_buffer.last[high+2] = 0xDC + ((value >> 8) & 0xFF);
            emitter->raw_buffer.last[low+2] = value & 0xFF;

            emitter->raw_buffer.last += 4;
        }
    }

    /* Write the raw buffer. */

    if (emitter->write_handler(emitter->write_handler_data,
                emitter->raw_buffer.start,
                emitter->raw_buffer.last - emitter->raw_buffer.start)) {
        emitter->buffer.last = emitter->buffer.start;
        emitter->buffer.pointer = emitter->buffer.start;
        emitter->raw_buffer.last = emitter->raw_buffer.start;
        emitter->raw_buffer.pointer = emitter->raw_buffer.start;
        return 1;
    }
    else {
        return yaml_emitter_set_writer_error(emitter, "write error");
    }
}